

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O2

int Acb_NtkFindMffcSize(Acb_Ntk_t *p,Vec_Int_t *vObjsRefed,Vec_Int_t *vObjsDerefed,int *nGates)

{
  Acb_ObjType_t AVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Vec_Int_t *p_00;
  int *piVar5;
  int iVar6;
  long lVar7;
  
  p_00 = Vec_IntStart((p->vObjType).nSize);
  iVar6 = 1;
  while( true ) {
    if ((p->vObjType).nSize <= iVar6) break;
    AVar1 = Acb_ObjType(p,iVar6);
    if (AVar1 != ABC_OPER_NONE) {
      piVar5 = Acb_ObjFanins(p,iVar6);
      for (lVar7 = 0; lVar7 < *piVar5; lVar7 = lVar7 + 1) {
        Vec_IntAddToEntry(p_00,piVar5[lVar7 + 1],1);
      }
    }
    iVar6 = iVar6 + 1;
  }
  for (iVar6 = 0; iVar6 < vObjsRefed->nSize; iVar6 = iVar6 + 1) {
    iVar2 = Vec_IntEntry(vObjsRefed,iVar6);
    Acb_NtkNodeRef_rec(p_00,p,iVar2,(int *)0x0);
  }
  iVar2 = 0;
  for (iVar6 = 0; iVar6 < vObjsDerefed->nSize; iVar6 = iVar6 + 1) {
    iVar3 = Vec_IntEntry(vObjsDerefed,iVar6);
    iVar4 = Vec_IntEntry(p_00,iVar3);
    if (iVar4 == 0) {
      iVar3 = Acb_NtkNodeRef_rec(p_00,p,iVar3,nGates);
      iVar2 = iVar2 + iVar3;
    }
  }
  Vec_IntFree(p_00);
  return iVar2;
}

Assistant:

int Acb_NtkFindMffcSize( Acb_Ntk_t * p, Vec_Int_t * vObjsRefed, Vec_Int_t * vObjsDerefed, int nGates[5] )
{
    Vec_Int_t * vRefs = Vec_IntStart( Acb_NtkObjNumMax(p) );
    int i, iObj, Fanin, * pFanins, Count2 = 0;
    Acb_NtkForEachObj( p, iObj )
        Acb_ObjForEachFaninFast( p, iObj, pFanins, Fanin, i )
            Vec_IntAddToEntry( vRefs, Fanin, 1 );
    Vec_IntForEachEntry( vObjsRefed, iObj, i )
        Acb_NtkNodeRef_rec( vRefs, p, iObj, NULL );
    Vec_IntForEachEntry( vObjsDerefed, iObj, i )
        if ( Vec_IntEntry(vRefs, iObj) == 0 )
            Count2 += Acb_NtkNodeRef_rec( vRefs, p, iObj, nGates );
    Vec_IntFree( vRefs );
    return Count2;
}